

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ukf.cpp
# Opt level: O0

void __thiscall UKF::UpdateLidar(UKF *this,MeasurementPackage *meas_package)

{
  int *x;
  Index IVar1;
  Scalar SVar2;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_118;
  XprTypeNested local_100;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_f8;
  ConstTransposeReturnType local_e0;
  Product<Eigen::Transpose<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_Eigen::Inverse<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>
  local_c8;
  Product<Eigen::Product<Eigen::Transpose<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_Eigen::Inverse<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_0>
  local_a8;
  undefined1 local_70 [8];
  MatrixXd Zsig;
  undefined1 local_48 [8];
  MatrixXd S;
  VectorXd z_pred;
  int n_z;
  MeasurementPackage *meas_package_local;
  UKF *this_local;
  
  IVar1 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::rows
                    (&(meas_package->raw_measurements_).
                      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>);
  z_pred.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_ =
       (undefined4)IVar1;
  x = (int *)((long)&z_pred.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                     .m_rows + 4);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>
            ((Matrix<double,__1,_1,_0,__1,_1> *)
             &S.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols,x)
  ;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>((Matrix<double,_1,_1,0,_1,_1> *)local_48,x,x)
  ;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_70,
             (int *)((long)&z_pred.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                            m_storage.m_rows + 4),&this->n_sigma_);
  PredictLidarMeasurement
            (this,&this->Xsig_pred_,(MatrixXd *)local_70,
             (VectorXd *)
             &S.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols,
             (MatrixXd *)local_48);
  UpdateState(this,&meas_package->raw_measurements_,
              (VectorXd *)
              &S.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols,
              (MatrixXd *)local_48,&this->Xsig_pred_,(MatrixXd *)local_70,&this->x_,&this->P_);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
            (&local_f8,
             (MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&meas_package->raw_measurements_,
             (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
             &S.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols);
  Eigen::
  DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::transpose(&local_e0,
              (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
               *)&local_f8);
  local_100 = (XprTypeNested)
              Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::inverse
                        ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_48);
  Eigen::
  MatrixBase<Eigen::Transpose<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const>>
  ::operator*(&local_c8,
              (MatrixBase<Eigen::Transpose<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
               *)&local_e0,
              (MatrixBase<Eigen::Inverse<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)&local_100);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
            (&local_118,
             (MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&meas_package->raw_measurements_,
             (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
             &S.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const>,Eigen::Inverse<Eigen::Matrix<double,-1,-1,0,-1,-1>>,0>>
  ::operator*(&local_a8,
              (MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>,Eigen::Inverse<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>>
               *)&local_c8,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
               *)&local_118);
  SVar2 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)&local_a8);
  this->NIS_lidar_ = SVar2;
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_70);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_48);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix
            ((Matrix<double,__1,_1,_0,__1,_1> *)
             &S.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols);
  return;
}

Assistant:

void UKF::UpdateLidar(MeasurementPackage meas_package) {
  int n_z = meas_package.raw_measurements_.rows();

  VectorXd z_pred(n_z);
  MatrixXd S(n_z, n_z);
  MatrixXd Zsig(n_z, n_sigma_);

  PredictLidarMeasurement(Xsig_pred_, Zsig, z_pred, S);
  UpdateState(meas_package.raw_measurements_, z_pred, S, Xsig_pred_, Zsig, x_, P_);

  NIS_lidar_ = ((meas_package.raw_measurements_-z_pred).transpose())*S.inverse()*(meas_package.raw_measurements_-z_pred);
}